

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void change_var_names(MIR_context_t new_ctx,VARR_MIR_var_t *vars)

{
  size_t sVar1;
  MIR_var_t *pMVar2;
  char *pcVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  lVar4 = 8;
  uVar5 = 0;
  while( true ) {
    sVar1 = VARR_MIR_var_tlength(vars);
    if (sVar1 <= uVar5) break;
    pMVar2 = VARR_MIR_var_taddr(vars);
    pcVar3 = get_ctx_str(new_ctx,*(char **)((long)&pMVar2->type + lVar4));
    *(char **)((long)&pMVar2->type + lVar4) = pcVar3;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

static void change_var_names (MIR_context_t new_ctx, VARR (MIR_var_t) * vars) {
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, vars); i++) {
    MIR_var_t *var_ptr = &VARR_ADDR (MIR_var_t, vars)[i];
    var_ptr->name = get_ctx_str (new_ctx, var_ptr->name);
  }
}